

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O2

void gen_spr_401x2(CPUPPCState_conflict2 *env)

{
  gen_spr_401(env);
  _spr_register(env,0x3b1,"PID",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  _spr_register(env,0x3b0,"ZPR",spr_noaccess,spr_noaccess,spr_read_generic,spr_write_generic,
                spr_read_generic,spr_write_generic,0);
  return;
}

Assistant:

static void gen_spr_401x2(CPUPPCState *env)
{
    gen_spr_401(env);
    spr_register(env, SPR_40x_PID, "PID",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    spr_register(env, SPR_40x_ZPR, "ZPR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
}